

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

void * Cnf_DataWriteIntoSolver2(Cnf_Dat_t *p,int nFrames,int fInit)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  sat_solver2 *s;
  ulong uVar4;
  Aig_Man_t *pAVar5;
  long lVar6;
  Vec_Ptr_t *pVVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int Lits [2];
  int Lits_1 [1];
  int local_50;
  int local_4c;
  int local_48;
  uint local_44;
  int *local_40;
  ulong local_38;
  
  if (nFrames < 1) {
    __assert_fail("nFrames > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfMan.c"
                  ,0x1e3,"void *Cnf_DataWriteIntoSolver2(Cnf_Dat_t *, int, int)");
  }
  s = sat_solver2_new();
  sat_solver2_setnvars(s,p->nVars * nFrames);
  lVar6 = 0;
LAB_005546fe:
  if (lVar6 < p->nClauses) goto code_r0x00554707;
  if (nFrames != 1) {
    iVar2 = p->nVars * 2;
    local_40 = *p->pClauses;
    uVar4 = 1;
    bVar1 = true;
    local_44 = nFrames;
    do {
      pAVar5 = p->pMan;
      iVar3 = pAVar5->nRegs;
      local_38 = uVar4;
      if (0 < iVar3) {
        iVar9 = 0;
        do {
          uVar8 = (pAVar5->nObjs[3] - iVar3) + iVar9;
          if (((((int)uVar8 < 0) || (pAVar5->vCos->nSize <= (int)uVar8)) ||
              (uVar10 = (pAVar5->nObjs[2] - iVar3) + iVar9, (int)uVar10 < 0)) ||
             (pAVar5->vCis->nSize <= (int)uVar10)) goto LAB_00554996;
          local_50 = ((int)uVar4 + -1) * iVar2 +
                     p->pVarNums[*(int *)((long)pAVar5->vCos->pArray[uVar8] + 0x24)] * 2;
          local_4c = ((int)uVar4 * iVar2 | 1U) +
                     p->pVarNums[*(int *)((long)pAVar5->vCis->pArray[uVar10] + 0x24)] * 2;
          iVar3 = sat_solver2_addclause(s,&local_50,&local_48,0);
          if (iVar3 == 0) goto LAB_005548e5;
          local_50 = local_50 + 1;
          local_4c = local_4c + -1;
          iVar3 = sat_solver2_addclause(s,&local_50,&local_48,0);
          if (iVar3 == 0) goto LAB_005548e5;
          iVar9 = iVar9 + 1;
          pAVar5 = p->pMan;
          iVar3 = pAVar5->nRegs;
        } while (iVar9 < iVar3);
      }
      if (0 < p->nLiterals) {
        lVar6 = 0;
        do {
          local_40[lVar6] = local_40[lVar6] + iVar2;
          lVar6 = lVar6 + 1;
        } while (lVar6 < p->nLiterals);
      }
      lVar6 = 0;
      while (lVar6 < p->nClauses) {
        iVar3 = sat_solver2_addclause(s,p->pClauses[lVar6],p->pClauses[lVar6 + 1],0);
        lVar6 = lVar6 + 1;
        if (iVar3 == 0) goto LAB_005548e5;
      }
      uVar8 = (int)local_38 + 1;
      uVar4 = (ulong)uVar8;
      bVar1 = (int)uVar8 < (int)local_44;
    } while (uVar8 != local_44);
    if (0 < p->nLiterals) {
      lVar6 = 0;
      do {
        local_40[lVar6] = local_40[lVar6] - (int)local_38 * iVar2;
        lVar6 = lVar6 + 1;
      } while (lVar6 < p->nLiterals);
    }
    goto LAB_005548f5;
  }
  goto LAB_005548fe;
code_r0x00554707:
  iVar2 = sat_solver2_addclause(s,p->pClauses[lVar6],p->pClauses[lVar6 + 1],0);
  lVar6 = lVar6 + 1;
  if (iVar2 == 0) goto LAB_00554729;
  goto LAB_005546fe;
LAB_005548e5:
  sat_solver2_delete(s);
LAB_005548f5:
  if (!bVar1) {
LAB_005548fe:
    if (fInit != 0) {
      pAVar5 = p->pMan;
      uVar8 = pAVar5->nObjs[2] - pAVar5->nRegs;
      pVVar7 = pAVar5->vCis;
      if ((int)uVar8 < pVVar7->nSize) {
        uVar4 = (ulong)uVar8;
        do {
          if ((int)uVar8 < 0) {
LAB_00554996:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          local_48 = p->pVarNums[*(int *)((long)pVVar7->pArray[uVar4] + 0x24)] * 2 + 1;
          iVar2 = sat_solver2_addclause(s,&local_48,(lit *)&local_44,0);
          if (iVar2 == 0) goto LAB_00554729;
          uVar4 = uVar4 + 1;
          pVVar7 = p->pMan->vCis;
        } while ((int)uVar4 < pVVar7->nSize);
      }
    }
    iVar2 = sat_solver2_simplify(s);
    if (iVar2 != 0) {
      return s;
    }
LAB_00554729:
    sat_solver2_delete(s);
  }
  return (void *)0x0;
}

Assistant:

void * Cnf_DataWriteIntoSolver2( Cnf_Dat_t * p, int nFrames, int fInit )
{
    sat_solver2 * pSat;
    int i, f, status;
    assert( nFrames > 0 );
    pSat = sat_solver2_new();
    sat_solver2_setnvars( pSat, p->nVars * nFrames );
    for ( i = 0; i < p->nClauses; i++ )
    {
        if ( !sat_solver2_addclause( pSat, p->pClauses[i], p->pClauses[i+1], 0 ) )
        {
            sat_solver2_delete( pSat );
            return NULL;
        }
    }
    if ( nFrames > 1 )
    {
        Aig_Obj_t * pObjLo, * pObjLi;
        int nLitsAll, * pLits, Lits[2];
        nLitsAll = 2 * p->nVars;
        pLits = p->pClauses[0];
        for ( f = 1; f < nFrames; f++ )
        {
            // add equality of register inputs/outputs for different timeframes
            Aig_ManForEachLiLoSeq( p->pMan, pObjLi, pObjLo, i )
            {
                Lits[0] = (f-1)*nLitsAll + toLitCond( p->pVarNums[pObjLi->Id], 0 );
                Lits[1] =  f   *nLitsAll + toLitCond( p->pVarNums[pObjLo->Id], 1 );
                if ( !sat_solver2_addclause( pSat, Lits, Lits + 2, 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
                Lits[0]++;
                Lits[1]--;
                if ( !sat_solver2_addclause( pSat, Lits, Lits + 2, 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
            }
            // add clauses for the next timeframe
            for ( i = 0; i < p->nLiterals; i++ )
                pLits[i] += nLitsAll;
            for ( i = 0; i < p->nClauses; i++ )
            {
                if ( !sat_solver2_addclause( pSat, p->pClauses[i], p->pClauses[i+1], 0 ) )
                {
                    sat_solver2_delete( pSat );
                    return NULL;
                }
            }
        }
        // return literals to their original state
        nLitsAll = (f-1) * nLitsAll;
        for ( i = 0; i < p->nLiterals; i++ )
            pLits[i] -= nLitsAll;
    }
    if ( fInit )
    {
        Aig_Obj_t * pObjLo;
        int Lits[1];
        Aig_ManForEachLoSeq( p->pMan, pObjLo, i )
        {
            Lits[0] = toLitCond( p->pVarNums[pObjLo->Id], 1 );
            if ( !sat_solver2_addclause( pSat, Lits, Lits + 1, 0 ) )
            {
                sat_solver2_delete( pSat );
                return NULL;
            }
        }
    }
    status = sat_solver2_simplify(pSat);
    if ( status == 0 )
    {
        sat_solver2_delete( pSat );
        return NULL;
    }
    return pSat;
}